

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mjs::interpreter::impl::scope::put_local(scope *this,string *key,value *val)

{
  bool bVar1;
  property_attribute a;
  long *plVar2;
  scope *this_00;
  gc_heap_ptr<mjs::object> act;
  
  gc_heap_ptr_untracked<mjs::object,_true>::track
            ((gc_heap_ptr_untracked<mjs::object,_true> *)&act.super_gc_heap_ptr_untyped,
             (gc_heap *)&this->activation_);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::activation_object>(&act.super_gc_heap_ptr_untyped);
  if (!bVar1) {
    bVar1 = is_global_object(&act);
    if (!bVar1) {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&act.super_gc_heap_ptr_untyped);
      string::view(key);
      a = (**(code **)(*plVar2 + 0x30))(plVar2);
      bVar1 = is_valid(a);
      if (!bVar1) {
        if ((this->prev_).pos_ == 0) {
          __assert_fail("prev_",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                        ,0x48f,
                        "void mjs::interpreter::impl::scope::put_local(const string &, const value &)"
                       );
        }
        this_00 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                            (&this->prev_,this->heap_);
        put_local(this_00,key,val);
        goto LAB_0011f8d9;
      }
    }
  }
  plVar2 = (long *)gc_heap_ptr_untyped::get(&act.super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x28))(plVar2,key,val,4);
LAB_0011f8d9:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&act.super_gc_heap_ptr_untyped);
  return;
}

Assistant:

void put_local(const string& key, const value& val) {
            auto act = activation_.track(heap_);
            // Hack-ish, but variable/function definitions end up in e.g. in the "with" object otherwise
            // The final check if is in the case of a variabl declaration 'shadowing' the catch identifier
            if (act.has_type<activation_object>() || is_global_object(act) || is_valid(act->own_property_attributes(key.view()))) {
                act->redefine_own_property(key, val, property_attribute::dont_delete);
            } else {
                assert(prev_);
                prev_.dereference(heap_).put_local(key, val);
            }
        }